

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

logical pnga_locate_nnodes(Integer g_a,Integer *lo,Integer *hi,Integer *np)

{
  ulong uVar1;
  uint uVar2;
  C_Integer *pCVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  Integer _i;
  long lVar7;
  long lVar8;
  long *plVar9;
  long lVar10;
  Integer _i_1;
  uint uVar11;
  int iVar12;
  Integer _factor;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int proc_subscript [7];
  int procB [7];
  int procT [7];
  
  lVar10 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar10)) {
    sprintf((char *)procT,"%s: INVALID ARRAY HANDLE","nga_locate_nnodes");
    pnga_error((char *)procT,g_a);
  }
  if (GA[lVar10].actv == 0) {
    sprintf((char *)procT,"%s: ARRAY NOT ACTIVE","nga_locate_nnodes");
    pnga_error((char *)procT,g_a);
  }
  lVar16 = (long)GA[lVar10].ndim;
  lVar7 = 0;
  if (0 < lVar16) {
    lVar7 = lVar16;
  }
  lVar15 = 0;
  while (lVar7 != lVar15) {
    if (lo[lVar15] < 1) {
      return 0;
    }
    plVar9 = hi + lVar15;
    if (*plVar9 < lo[lVar15]) {
      return 0;
    }
    pCVar3 = GA[lVar10].dims + lVar15;
    lVar15 = lVar15 + 1;
    if (*pCVar3 < *plVar9) {
      return 0;
    }
  }
  if (GA[lVar10].distr_type != 0) {
    lVar15 = 0;
    lVar7 = GA[lVar10].block_total;
    if (GA[lVar10].block_total < 1) {
      lVar7 = lVar15;
    }
    bVar5 = true;
    lVar10 = 0;
    for (; lVar15 != lVar7; lVar15 = lVar15 + 1) {
      pnga_distribution(g_a,lVar15,(Integer *)procT,(Integer *)procB);
      bVar4 = bVar5;
      for (lVar8 = 0; (bVar4 && (lVar8 < lVar16)); lVar8 = lVar8 + 1) {
        if (((*(long *)(procT + lVar8 * 2) < lo[lVar8]) ||
            (bVar4 = bVar5, hi[lVar8] < *(long *)(procT + lVar8 * 2))) &&
           ((*(long *)(procB + lVar8 * 2) < lo[lVar8] ||
            (bVar4 = bVar5, hi[lVar8] < *(long *)(procB + lVar8 * 2))))) {
          bVar4 = false;
        }
      }
      lVar10 = (lVar10 + 1) - (ulong)!bVar4;
    }
    *np = lVar10;
    return 1;
  }
  lVar16 = 0;
  lVar15 = 0;
LAB_00161fdc:
  if (lVar15 != lVar7) {
    lVar8 = lo[lVar15];
    pCVar3 = GA[lVar10].mapc;
    uVar11 = (uint)((double)lVar8 * GA[lVar10].scale[lVar15]);
    uVar2 = GA[lVar10].nblock[lVar15];
    uVar1 = (long)(int)uVar2 - 1;
    uVar13 = (ulong)uVar11;
    if (uVar2 == uVar11) {
      uVar13 = uVar1 & 0xffffffff;
    }
    iVar12 = (int)uVar13;
    if (lVar8 < pCVar3[lVar16 + iVar12]) {
      plVar9 = pCVar3 + lVar16 + uVar13;
      do {
        plVar9 = plVar9 + -1;
        if ((int)uVar13 < 1) goto LAB_0016206f;
        uVar11 = (int)uVar13 - 1;
        uVar13 = (ulong)uVar11;
      } while (lVar8 < *plVar9);
    }
    else {
      uVar11 = iVar12 - 1;
      lVar14 = (long)iVar12;
      do {
        if ((long)uVar1 <= lVar14) goto LAB_0016206f;
        uVar11 = uVar11 + 1;
        lVar6 = lVar14 + 1;
        lVar14 = lVar14 + 1;
      } while (pCVar3[lVar16 + lVar6] <= lVar8);
    }
    goto LAB_00162072;
  }
  lVar16 = 0;
  lVar15 = 0;
LAB_0016208e:
  if (lVar15 == lVar7) {
    *np = 0;
    lVar10 = 1;
    for (lVar16 = 0; lVar7 != lVar16; lVar16 = lVar16 + 1) {
      lVar10 = lVar10 * ((procB[lVar16] - procT[lVar16]) + 1);
      proc_subscript[lVar16] = procT[lVar16];
    }
    lVar16 = 0;
    if (lVar10 < 1) {
      lVar10 = lVar16;
    }
    do {
      if (lVar16 == lVar10) {
        return 1;
      }
      for (lVar15 = 0; lVar7 != lVar15; lVar15 = lVar15 + 1) {
      }
      for (lVar15 = 0; lVar7 != lVar15; lVar15 = lVar15 + 1) {
        if (proc_subscript[lVar15] < procB[lVar15]) {
          proc_subscript[lVar15] = proc_subscript[lVar15] + 1;
          break;
        }
        proc_subscript[lVar15] = procT[lVar15];
      }
      lVar16 = lVar16 + 1;
      *np = lVar16;
    } while( true );
  }
  lVar8 = hi[lVar15];
  pCVar3 = GA[lVar10].mapc;
  uVar11 = (uint)((double)lVar8 * GA[lVar10].scale[lVar15]);
  uVar2 = GA[lVar10].nblock[lVar15];
  uVar1 = (long)(int)uVar2 - 1;
  uVar13 = (ulong)uVar11;
  if (uVar2 == uVar11) {
    uVar13 = uVar1 & 0xffffffff;
  }
  iVar12 = (int)uVar13;
  if (lVar8 < pCVar3[lVar16 + iVar12]) {
    plVar9 = pCVar3 + lVar16 + uVar13;
    do {
      plVar9 = plVar9 + -1;
      if ((int)uVar13 < 1) goto LAB_00162121;
      uVar11 = (int)uVar13 - 1;
      uVar13 = (ulong)uVar11;
    } while (lVar8 < *plVar9);
  }
  else {
    uVar11 = iVar12 - 1;
    lVar14 = (long)iVar12;
    do {
      if ((long)uVar1 <= lVar14) goto LAB_00162121;
      uVar11 = uVar11 + 1;
      lVar6 = lVar14 + 1;
      lVar14 = lVar14 + 1;
    } while (pCVar3[lVar16 + lVar6] <= lVar8);
  }
  goto LAB_00162124;
LAB_0016206f:
  uVar11 = (uint)uVar1;
LAB_00162072:
  procT[lVar15] = uVar11;
  lVar16 = lVar16 + (int)uVar2;
  lVar15 = lVar15 + 1;
  goto LAB_00161fdc;
LAB_00162121:
  uVar11 = (uint)uVar1;
LAB_00162124:
  procB[lVar15] = uVar11;
  lVar16 = lVar16 + (int)uVar2;
  lVar15 = lVar15 + 1;
  goto LAB_0016208e;
}

Assistant:

logical pnga_locate_nnodes( Integer g_a,
                                 Integer *lo,
                                 Integer *hi,
                                 Integer *np)
/*    g_a      [input]  global array handle
      lo       [input]  lower indices of patch in global array
      hi       [input]  upper indices of patch in global array
      np       [output] total number of processors containing a portion
                        of the patch

      For a block cyclic data distribution, this function returns a list of
      blocks that cover the region along with the lower and upper indices of
      each block.
*/
{
  int  procT[MAXDIM], procB[MAXDIM], proc_subscript[MAXDIM];
  Integer  proc, i, ga_handle;
  Integer  d, dpos, ndim, elems, use_blocks;
  /* Integer  p_handle; */

  ga_check_handleM(g_a, "nga_locate_nnodes");

  ga_handle = GA_OFFSET + g_a;

  for(d = 0; d< GA[ga_handle].ndim; d++)
    if((lo[d]<1 || hi[d]>GA[ga_handle].dims[d]) ||(lo[d]>hi[d]))return FALSE;

  ndim = GA[ga_handle].ndim;

  if (GA[ga_handle].distr_type == REGULAR) {
    /* find "processor coordinates" for the top left corner and store them
     * in ProcT */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], lo[d], &procT[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    /* find "processor coordinates" for the right bottom corner and store
     * them in procB */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], hi[d], &procB[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    *np = 0;

    /* Find total number of processors containing data and return the
     * result in elems. Also find the lowest "processor coordinates" of the
     * processor block containing data and return these in proc_subscript.
     */
    ga_InitLoopM(&elems, ndim, proc_subscript, procT,procB,GA[ga_handle].nblock);

    /* p_handle = (Integer)GA[ga_handle].p_handle; */
    for(i= 0; i< elems; i++){ 
      Integer _lo[MAXDIM], _hi[MAXDIM];

      /* convert i to owner processor id using the current values in
         proc_subscript */
      ga_ComputeIndexM(&proc, ndim, proc_subscript, GA[ga_handle].nblock); 
      /* get range of global array indices that are owned by owner */
      ga_ownsM(ga_handle, proc, _lo, _hi);

      /* Update to proc_subscript so that it corresponds to the next
       * processor in the block of processors containing the patch */
      ga_UpdateSubscriptM(ndim,proc_subscript,procT,procB,GA[ga_handle].nblock);
      (*np)++;
    }
  } else {
    Integer nblocks = GA[ga_handle].block_total;
    Integer chk, j, tlo[MAXDIM], thi[MAXDIM], cnt;
    cnt = 0;
    for (i=0; i<nblocks; i++) {
      /* check to see if this block overlaps with requested block
       * defined by lo and hi */
      chk = 1;
      /* get limits on block i */
      pnga_distribution(g_a,i,tlo,thi);
      for (j=0; j<ndim && chk==1; j++) {
        /* check to see if at least one end point of the interval
         * represented by blo and bhi falls in the interval
         * represented by lo and hi */
        if (!((tlo[j] >= lo[j] && tlo[j] <= hi[j]) ||
              (thi[j] >= lo[j] && thi[j] <= hi[j]))) {
          chk = 0;
        }
      }
      /* store blocks that overlap request region in proclist */
      if (chk) {
        cnt++;
      }
    }
    *np = cnt;
  }
  return(TRUE);
}